

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  u32 amt;
  uchar *pBuf;
  ulong uVar4;
  u8 *pCellBody;
  void *pCellKey;
  Mem *pMStack_78;
  int nCell;
  i64 nCellKey;
  u8 *pCell;
  MemPage *pPage;
  int local_58;
  Pgno chldPg;
  int c;
  int idx;
  int upr;
  int lwr;
  RecordCompare xRecordCompare;
  int *piStack_38;
  int rc;
  int *pRes_local;
  Mem *pMStack_28;
  int biasRight_local;
  i64 intKey_local;
  UnpackedRecord *pIdxKey_local;
  BtCursor *pCur_local;
  
  piStack_38 = pRes;
  pRes_local._4_4_ = biasRight;
  pMStack_28 = (Mem *)intKey;
  intKey_local = (i64)pIdxKey;
  pIdxKey_local = (UnpackedRecord *)pCur;
  if (((pIdxKey == (UnpackedRecord *)0x0) && (pCur->eState == '\x01')) &&
     ((pCur->curFlags & 2) != 0)) {
    if ((pCur->info).nKey == intKey) {
      *pRes = 0;
      return 0;
    }
    if ((pCur->info).nKey < intKey) {
      if ((pCur->curFlags & 8) != 0) {
        *pRes = -1;
        return 0;
      }
      if (((pCur->info).nKey + 1 == intKey) && (pCur->skipNext == 0)) {
        *pRes = 0;
        xRecordCompare._4_4_ = sqlite3BtreeNext(pCur,0);
        if (xRecordCompare._4_4_ == 0) {
          getCellInfo((BtCursor *)pIdxKey_local);
          if (pIdxKey_local[1].aMem == pMStack_28) {
            return 0;
          }
        }
        else {
          if (xRecordCompare._4_4_ != 0x65) {
            return xRecordCompare._4_4_;
          }
          xRecordCompare._4_4_ = 0;
        }
      }
    }
  }
  if (intKey_local == 0) {
    _upr = (RecordCompare)0x0;
  }
  else {
    _upr = sqlite3VdbeFindCompare((UnpackedRecord *)intKey_local);
    *(undefined1 *)(intKey_local + 0x13) = 0;
  }
  pCur_local._4_4_ = moveToRoot((BtCursor *)pIdxKey_local);
  if (pCur_local._4_4_ == 0) {
    if (*(char *)((long)&pIdxKey_local[3].aMem + 6) != '\0') {
LAB_00157cf3:
      xRecordCompare._4_4_ = 0;
      pCell = (u8 *)(&pIdxKey_local[6].pKeyInfo)[(char)pIdxKey_local[3].nField];
      idx = 0;
      c = *(ushort *)((long)&((KeyInfo *)pCell)->db + 6) - 1;
      chldPg = c >> (1U - (char)pRes_local._4_4_ & 0x1f);
      pIdxKey_local[3].default_rc = (char)(short)chldPg;
      pIdxKey_local[3].errCode = (char)((ushort)(short)chldPg >> 8);
      if (_upr == (RecordCompare)0x0) {
        do {
          nCellKey = *(long *)(pCell + 0x68) +
                     (long)(int)(uint)(*(ushort *)(pCell + 0x18) &
                                      CONCAT11(*(undefined1 *)
                                                (*(long *)(pCell + 0x60) + (long)(int)(chldPg << 1))
                                               ,*(undefined1 *)
                                                 (*(long *)(pCell + 0x60) + 1 +
                                                 (long)(int)(chldPg << 1))));
          if (pCell[3] != '\0') {
            while (uVar4 = nCellKey + 1, bVar1 = *(byte *)nCellKey, nCellKey = uVar4, 0x7f < bVar1)
            {
              if (*(ulong *)(pCell + 0x58) <= uVar4) {
                iVar3 = sqlite3CorruptError(0xfd37);
                return iVar3;
              }
            }
          }
          sqlite3GetVarint((uchar *)nCellKey,(u64 *)&stack0xffffffffffffff88);
          if ((long)pMStack_78 < (long)pMStack_28) {
            idx = chldPg + 1;
            if (c < idx) {
              local_58 = -1;
              goto LAB_001580ea;
            }
          }
          else {
            if ((long)pMStack_78 <= (long)pMStack_28) {
              pIdxKey_local[3].default_rc = (char)(short)chldPg;
              pIdxKey_local[3].errCode = (char)((ushort)(short)chldPg >> 8);
              if (pCell[8] != '\0') {
                *(byte *)((long)&pIdxKey_local[3].aMem + 4) =
                     *(byte *)((long)&pIdxKey_local[3].aMem + 4) | 2;
                pIdxKey_local[1].aMem = pMStack_78;
                *(undefined2 *)((long)&pIdxKey_local[2].pKeyInfo + 6) = 0;
                *piStack_38 = 0;
                return 0;
              }
              idx = chldPg;
              goto LAB_00158119;
            }
            c = chldPg - 1;
            if (c < idx) goto code_r0x00157e35;
          }
          chldPg = idx + c >> 1;
        } while( true );
      }
      while( true ) {
        nCellKey = *(long *)(pCell + 0x68) +
                   (long)(int)(uint)(*(ushort *)(pCell + 0x18) &
                                    CONCAT11(*(undefined1 *)
                                              (*(long *)(pCell + 0x60) + (long)(int)(chldPg << 1)),
                                             *(undefined1 *)
                                              (*(long *)(pCell + 0x60) + 1 +
                                              (long)(int)(chldPg << 1))));
        bVar1 = *(byte *)nCellKey;
        if ((ushort)pCell[0xb] < (ushort)bVar1) {
          if (((*(byte *)(nCellKey + 1) & 0x80) == 0) &&
             (uVar2 = (bVar1 & 0x7f) * 0x80 + (ushort)*(byte *)(nCellKey + 1),
             uVar2 <= *(ushort *)(pCell + 0xe))) {
            local_58 = (*_upr)((int)uVar2,(byte *)(nCellKey + 2),(UnpackedRecord *)intKey_local);
          }
          else {
            (**(code **)(pCell + 0x80))
                      (pCell,nCellKey - (int)(uint)pCell[10],&pIdxKey_local[1].aMem);
            amt = (u32)pIdxKey_local[1].aMem;
            if ((int)amt < 2) {
              xRecordCompare._4_4_ = sqlite3CorruptError(0xfd81);
              goto LAB_001581c3;
            }
            pBuf = (uchar *)sqlite3Malloc((long)(int)(amt + 0x12));
            if (pBuf == (uchar *)0x0) {
              xRecordCompare._4_4_ = 7;
              goto LAB_001581c3;
            }
            pIdxKey_local[3].default_rc = (char)(short)chldPg;
            pIdxKey_local[3].errCode = (char)((ushort)(short)chldPg >> 8);
            xRecordCompare._4_4_ = accessPayload((BtCursor *)pIdxKey_local,0,amt,pBuf,0);
            *(byte *)((long)&pIdxKey_local[3].aMem + 4) =
                 *(byte *)((long)&pIdxKey_local[3].aMem + 4) & 0xfb;
            if (xRecordCompare._4_4_ != 0) {
              sqlite3_free(pBuf);
              goto LAB_001581c3;
            }
            local_58 = (*_upr)(amt,pBuf,(UnpackedRecord *)intKey_local);
            sqlite3_free(pBuf);
          }
        }
        else {
          local_58 = (*_upr)((uint)bVar1,(byte *)(nCellKey + 1),(UnpackedRecord *)intKey_local);
        }
        if (local_58 < 0) {
          idx = chldPg + 1;
        }
        else {
          if (local_58 < 1) {
            *piStack_38 = 0;
            xRecordCompare._4_4_ = 0;
            pIdxKey_local[3].default_rc = (char)(short)chldPg;
            pIdxKey_local[3].errCode = (char)((ushort)(short)chldPg >> 8);
            if (*(char *)(intKey_local + 0x13) != '\0') {
              xRecordCompare._4_4_ = 0xb;
            }
            goto LAB_001581c3;
          }
          c = chldPg - 1;
        }
        if (c < idx) break;
        chldPg = idx + c >> 1;
      }
      goto LAB_001580ea;
    }
    *piStack_38 = -1;
    pCur_local._4_4_ = 0;
  }
  return pCur_local._4_4_;
code_r0x00157e35:
  local_58 = 1;
LAB_001580ea:
  if (pCell[8] != '\0') {
    pIdxKey_local[3].default_rc = (char)(short)chldPg;
    pIdxKey_local[3].errCode = (char)((ushort)(short)chldPg >> 8);
    *piStack_38 = local_58;
    xRecordCompare._4_4_ = 0;
    goto LAB_001581c3;
  }
LAB_00158119:
  if (idx < (int)(uint)*(ushort *)(pCell + 0x16)) {
    pPage._4_4_ = sqlite3Get4byte((u8 *)(*(long *)(pCell + 0x50) +
                                        (long)(int)(uint)(*(ushort *)(pCell + 0x18) &
                                                         CONCAT11(*(undefined1 *)
                                                                   (*(long *)(pCell + 0x60) +
                                                                   (long)(idx << 1)),
                                                                  *(undefined1 *)
                                                                   (*(long *)(pCell + 0x60) + 1 +
                                                                   (long)(idx << 1))))));
  }
  else {
    pPage._4_4_ = sqlite3Get4byte((u8 *)(*(long *)(pCell + 0x50) + (long)(int)(pCell[9] + 8)));
  }
  pIdxKey_local[3].default_rc = (char)(short)idx;
  pIdxKey_local[3].errCode = (char)((ushort)(short)idx >> 8);
  xRecordCompare._4_4_ = moveToChild((BtCursor *)pIdxKey_local,pPage._4_4_);
  if (xRecordCompare._4_4_ != 0) {
LAB_001581c3:
    *(undefined2 *)((long)&pIdxKey_local[2].pKeyInfo + 6) = 0;
    return xRecordCompare._4_4_;
  }
  goto LAB_00157cf3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );
  assert( pCur->eState!=CURSOR_VALID || (pIdxKey==0)==(pCur->curIntKey!=0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pIdxKey==0
   && pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowely */
      if( pCur->info.nKey+1==intKey && !pCur->skipNext ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc==SQLITE_DONE ){
          rc = SQLITE_OK;
        }else{
          return rc;
        }
      }
    }
  }

  if( pIdxKey ){
    xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
    pIdxKey->errCode = 0;
    assert( pIdxKey->default_rc==1 
         || pIdxKey->default_rc==0 
         || pIdxKey->default_rc==-1
    );
  }else{
    xRecordCompare = 0; /* All keys are integers */
  }

  rc = moveToRoot(pCur);
  if( rc ){
    return rc;
  }
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage] );
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->isInit );
  assert( pCur->eState==CURSOR_INVALID || pCur->apPage[pCur->iPage]->nCell>0 );
  if( pCur->eState==CURSOR_INVALID ){
    *pRes = -1;
    assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->nCell==0 );
    return SQLITE_OK;
  }
  assert( pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey || pIdxKey );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->apPage[pCur->iPage];
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    pCur->ix = (u16)idx;
    if( xRecordCompare==0 ){
      for(;;){
        i64 nCellKey;
        pCell = findCellPastPtr(pPage, idx);
        if( pPage->intKeyLeaf ){
          while( 0x80 <= *(pCell++) ){
            if( pCell>=pPage->aDataEnd ){
              return SQLITE_CORRUPT_PGNO(pPage->pgno);
            }
          }
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey<intKey ){
          lwr = idx+1;
          if( lwr>upr ){ c = -1; break; }
        }else if( nCellKey>intKey ){
          upr = idx-1;
          if( lwr>upr ){ c = +1; break; }
        }else{
          assert( nCellKey==intKey );
          pCur->ix = (u16)idx;
          if( !pPage->leaf ){
            lwr = idx;
            goto moveto_next_layer;
          }else{
            pCur->curFlags |= BTCF_ValidNKey;
            pCur->info.nKey = nCellKey;
            pCur->info.nSize = 0;
            *pRes = 0;
            return SQLITE_OK;
          }
        }
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
      }
    }else{
      for(;;){
        int nCell;  /* Size of the pCell cell in bytes */
        pCell = findCellPastPtr(pPage, idx);

        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. 
          **
          ** If the record is corrupt, the xRecordCompare routine may read
          ** up to two varints past the end of the buffer. An extra 18 
          ** bytes of padding is allocated at the end of the buffer in
          ** case this happens.  */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          pPage->xParseCell(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          testcase( nCell<0 );   /* True if key size is 2^32 or more */
          testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
          testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
          testcase( nCell==2 );  /* Minimum legal index key size */
          if( nCell<2 ){
            rc = SQLITE_CORRUPT_PGNO(pPage->pgno);
            goto moveto_finish;
          }
          pCellKey = sqlite3Malloc( nCell+18 );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM_BKPT;
            goto moveto_finish;
          }
          pCur->ix = (u16)idx;
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          pCur->curFlags &= ~BTCF_ValidOvfl;
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = xRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
        assert( 
            (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
         && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
        );
        if( c<0 ){
          lwr = idx+1;
        }else if( c>0 ){
          upr = idx-1;
        }else{
          assert( c==0 );
          *pRes = 0;
          rc = SQLITE_OK;
          pCur->ix = (u16)idx;
          if( pIdxKey->errCode ) rc = SQLITE_CORRUPT;
          goto moveto_finish;
        }
        if( lwr>upr ) break;
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
      }
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->apPage[pCur->iPage]->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
moveto_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}